

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLElement * __thiscall tinyxml2::XMLNode::NextSiblingElement(XMLNode *this,char *name)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *q;
  XMLElement *element;
  XMLNode *node;
  char *name_local;
  XMLNode *this_local;
  XMLElement *this_00;
  
  element = (XMLElement *)this->_next;
  do {
    if (element == (XMLElement *)0x0) {
      return (XMLElement *)0x0;
    }
    iVar2 = (*(element->super_XMLNode)._vptr_XMLNode[6])();
    this_00 = (XMLElement *)CONCAT44(extraout_var,iVar2);
    if (this_00 != (XMLElement *)0x0) {
      if (name == (char *)0x0) {
        return this_00;
      }
      q = XMLElement::Name(this_00);
      bVar1 = XMLUtil::StringEqual(name,q,0x7fffffff);
      if (bVar1) {
        return this_00;
      }
    }
    element = (XMLElement *)(element->super_XMLNode)._next;
  } while( true );
}

Assistant:

const XMLElement* XMLNode::NextSiblingElement( const char* name ) const
{
    for( const XMLNode* node = _next; node; node = node->_next ) {
        const XMLElement* element = node->ToElement();
        if ( element
                && (!name || XMLUtil::StringEqual( name, element->Name() ))) {
            return element;
        }
    }
    return 0;
}